

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_4x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  uint8_t uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i zero;
  __m128i weight_2;
  __m128i weight_1;
  __m128i weight;
  __m128i inverter;
  __m128i sum;
  __m128i alternate_weights;
  __m128i inverted_weight_y;
  __m128i weight_y;
  int y;
  __m128i y_select;
  __m128i cvtepu8_epi32;
  __m128i mask_increment;
  __m128i pred_round;
  int val_1;
  int val;
  int val_2;
  undefined8 local_648;
  undefined8 uStack_640;
  ushort local_5f8;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4bc;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  uint8_t *local_470;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  byte local_2d8;
  undefined1 uStack_2d7;
  undefined1 uStack_2d6;
  undefined1 uStack_2d5;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  __m128i weights [2];
  __m128i pixels;
  uint8_t *left_column_local;
  uint8_t *top_row_local;
  ptrdiff_t stride_local;
  uint8_t *dst_local;
  __m128i bottom_left;
  __m128i top;
  
  uVar2 = *(undefined4 *)top_row;
  uVar1 = left_column[7];
  local_2d8 = (byte)uVar2;
  uStack_2d7 = (undefined1)((uint)uVar2 >> 8);
  uStack_2d6 = (undefined1)((uint)uVar2 >> 0x10);
  uStack_2d5 = (undefined1)((uint)uVar2 >> 0x18);
  local_5f8 = CONCAT11(0,local_2d8);
  local_648._0_2_ = 1;
  local_648._2_2_ = 0x3b;
  local_648._4_2_ = 0x6e;
  local_648._6_2_ = 0x97;
  uStack_640._0_2_ = 0xb7;
  uStack_640._2_2_ = 0xce;
  uStack_640._4_2_ = 0xdb;
  uStack_640._6_2_ = 0xe0;
  local_4b8 = 0x100010001000100;
  uStack_4b0 = 0x100010001000100;
  local_470 = dst;
  for (local_4bc = 0; local_4bc < 8; local_4bc = local_4bc + 1) {
    auVar6[8] = 0x49;
    auVar6._0_8_ = 0x69009200c500ff;
    auVar6[9] = 0;
    auVar6[10] = 0x32;
    auVar6[0xb] = 0;
    auVar6[0xc] = 0x25;
    auVar6[0xd] = 0;
    auVar6[0xe] = 0x20;
    auVar6[0xf] = 0;
    auVar4._8_8_ = uStack_4b0;
    auVar4._0_8_ = local_4b8;
    auVar9 = pshufb(auVar6,auVar4);
    auVar7._8_8_ = uStack_640;
    auVar7._0_8_ = local_648;
    auVar3._8_8_ = uStack_4b0;
    auVar3._0_8_ = local_4b8;
    auVar10 = pshufb(auVar7,auVar3);
    local_128 = auVar9._0_2_;
    uStack_126 = auVar9._2_2_;
    uStack_124 = auVar9._4_2_;
    uStack_122 = auVar9._6_2_;
    local_138 = auVar10._0_2_;
    uStack_136 = auVar10._2_2_;
    uStack_134 = auVar10._4_2_;
    uStack_132 = auVar10._6_2_;
    auVar8[2] = uVar1;
    auVar8._0_2_ = local_5f8;
    auVar8[3] = 0;
    auVar8[4] = uStack_2d7;
    auVar8[5] = 0;
    auVar8[6] = uVar1;
    auVar8[7] = 0;
    auVar8[8] = uStack_2d6;
    auVar8[9] = 0;
    auVar8[10] = uVar1;
    auVar8[0xb] = 0;
    auVar8[0xc] = uStack_2d5;
    auVar8[0xd] = 0;
    auVar8[0xe] = uVar1;
    auVar8[0xf] = 0;
    auVar5._2_2_ = local_138;
    auVar5._0_2_ = local_128;
    auVar5._4_2_ = uStack_126;
    auVar5._6_2_ = uStack_136;
    auVar5._10_2_ = uStack_134;
    auVar5._8_2_ = uStack_124;
    auVar5._12_2_ = uStack_122;
    auVar5._14_2_ = uStack_132;
    auVar9 = pmaddwd(auVar8,auVar5);
    local_c8 = auVar9._0_4_;
    iStack_c4 = auVar9._4_4_;
    iStack_c0 = auVar9._8_4_;
    iStack_bc = auVar9._12_4_;
    auVar9 = ZEXT416(8);
    local_508 = CONCAT44(iStack_c4 + 0x80 >> auVar9,local_c8 + 0x80 >> auVar9);
    uStack_500._0_4_ = iStack_c0 + 0x80 >> auVar9;
    uStack_500._4_4_ = iStack_bc + 0x80 >> auVar9;
    auVar10._8_8_ = uStack_500;
    auVar10._0_8_ = local_508;
    auVar9._8_8_ = 0xc0804000c080400;
    auVar9._0_8_ = 0xc0804000c080400;
    auVar9 = pshufb(auVar10,auVar9);
    dst_local._0_4_ = auVar9._0_4_;
    *(undefined4 *)local_470 = dst_local._0_4_;
    local_470 = local_470 + stride;
    local_3d8 = (short)local_4b8;
    sStack_3d6 = (short)((ulong)local_4b8 >> 0x10);
    sStack_3d4 = (short)((ulong)local_4b8 >> 0x20);
    sStack_3d2 = (short)((ulong)local_4b8 >> 0x30);
    sStack_3d0 = (short)uStack_4b0;
    sStack_3ce = (short)((ulong)uStack_4b0 >> 0x10);
    sStack_3cc = (short)((ulong)uStack_4b0 >> 0x20);
    sStack_3ca = (short)((ulong)uStack_4b0 >> 0x30);
    local_4b8 = CONCAT26(sStack_3d2 + 0x202,
                         CONCAT24(sStack_3d4 + 0x202,CONCAT22(sStack_3d6 + 0x202,local_3d8 + 0x202))
                        );
    uStack_4b0 = CONCAT26(sStack_3ca + 0x202,
                          CONCAT24(sStack_3cc + 0x202,
                                   CONCAT22(sStack_3ce + 0x202,sStack_3d0 + 0x202)));
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_4x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  __m128i pixels;
  load_smooth_vertical_pixels4(top_row, left_column, 8, &pixels);

  __m128i weights[2];
  load_smooth_vertical_weights4(smooth_weights, 8, weights);

  write_smooth_vertical4xh(&pixels, weights, 8, dst, stride);
}